

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

int __thiscall
slang::SmallVectorBase<slang::parsing::Trivia>::copy
          (SmallVectorBase<slang::parsing::Trivia> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Trivia *__ifirst;
  uninitialized_copy_result<const_slang::parsing::Trivia_*,_slang::parsing::Trivia_*> uVar1;
  pointer dest;
  undefined1 in_stack_ffffffffffffffc8 [16];
  BumpAllocator *in_stack_ffffffffffffffd8;
  int local_10;
  
  if (this->len == 0) {
    std::span<slang::parsing::Trivia,_18446744073709551615UL>::span
              ((span<slang::parsing::Trivia,_18446744073709551615UL> *)0x278259);
  }
  else {
    __ifirst = (Trivia *)
               BumpAllocator::allocate
                         (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffc8._8_8_,
                          in_stack_ffffffffffffffc8._0_8_);
    begin(this);
    end(this);
    uVar1 = std::ranges::__uninitialized_copy_fn::
            operator()<const_slang::parsing::Trivia_*,_const_slang::parsing::Trivia_*,_slang::parsing::Trivia_*,_slang::parsing::Trivia_*>
                      ((__uninitialized_copy_fn *)dst,__ifirst,in_stack_ffffffffffffffc8._8_8_,
                       in_stack_ffffffffffffffc8._0_8_,(Trivia *)this);
    std::span<slang::parsing::Trivia,_18446744073709551615UL>::span<slang::parsing::Trivia_*>
              ((span<slang::parsing::Trivia,_18446744073709551615UL> *)uVar1.out,uVar1.in,
               (size_type)this);
  }
  return local_10;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }